

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

Result __thiscall
presolve::HPresolve::aggregator(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *this_00;
  bool bVar1;
  int row;
  int col;
  pair<int,_int> *ppVar2;
  pair<int,_int> *ppVar3;
  pointer pdVar4;
  HighsPostsolveStack *pHVar5;
  bool bVar6;
  bool bVar7;
  char cVar8;
  HighsInt HVar9;
  Result RVar10;
  Result RVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  double *pdVar15;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  __it;
  int *piVar16;
  iterator __first;
  pointer piVar17;
  pair<int,_int> *ppVar18;
  byte bVar19;
  int iVar20;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  _Var21;
  pointer ppVar22;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  _Var23;
  long lVar24;
  double dVar25;
  HPresolve *local_60;
  int local_54;
  HighsPostsolveStack *local_50;
  HPresolveAnalysis *local_48;
  pointer local_40;
  pair<int,_int> local_38;
  
  local_48 = &this->analysis_;
  bVar1 = (this->analysis_).logging_on_;
  if (bVar1 == true) {
    HPresolveAnalysis::startPresolveRuleLog(local_48,0xc);
  }
  ppVar2 = (this->substitutionOpportunities).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  ppVar3 = (this->substitutionOpportunities).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar13 = (long)ppVar3 - (long)ppVar2;
  __it._M_current = ppVar2;
  _Var23._M_current = ppVar2;
  local_60 = this;
  local_50 = postsolve_stack;
  local_38 = (pair<int,_int>)this;
  if (0 < (long)uVar13 >> 5) {
    _Var23._M_current = (pair<int,_int> *)((long)&ppVar2->first + (uVar13 & 0xffffffffffffffe0));
    lVar24 = ((long)uVar13 >> 5) + 1;
    do {
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::$_0>::
              operator()((_Iter_pred<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__0>
                          *)&local_60,__it);
      _Var21._M_current = __it._M_current;
      if (bVar6) goto LAB_0031a4b3;
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::$_0>::
              operator()((_Iter_pred<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__0>
                          *)&local_60,__it._M_current + 1);
      _Var21._M_current = __it._M_current + 1;
      if (bVar6) goto LAB_0031a4b3;
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::$_0>::
              operator()((_Iter_pred<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__0>
                          *)&local_60,__it._M_current + 2);
      _Var21._M_current = __it._M_current + 2;
      if (bVar6) goto LAB_0031a4b3;
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::$_0>::
              operator()((_Iter_pred<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__0>
                          *)&local_60,__it._M_current + 3);
      _Var21._M_current = __it._M_current + 3;
      if (bVar6) goto LAB_0031a4b3;
      __it._M_current = __it._M_current + 4;
      lVar24 = lVar24 + -1;
    } while (1 < lVar24);
  }
  lVar24 = (long)ppVar3 - (long)_Var23._M_current >> 3;
  if (lVar24 == 1) {
LAB_0031a498:
    bVar6 = __gnu_cxx::__ops::
            _Iter_pred<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::$_0>::
            operator()((_Iter_pred<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__0>
                        *)&local_60,_Var23);
    _Var21._M_current = _Var23._M_current;
    if (!bVar6) {
      _Var21._M_current = ppVar3;
    }
  }
  else if (lVar24 == 2) {
LAB_0031a483:
    bVar6 = __gnu_cxx::__ops::
            _Iter_pred<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::$_0>::
            operator()((_Iter_pred<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__0>
                        *)&local_60,_Var23);
    _Var21._M_current = _Var23._M_current;
    if (!bVar6) {
      _Var23._M_current = _Var23._M_current + 1;
      goto LAB_0031a498;
    }
  }
  else {
    _Var21._M_current = ppVar3;
    if ((lVar24 == 3) &&
       (bVar6 = __gnu_cxx::__ops::
                _Iter_pred<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::$_0>::
                operator()((_Iter_pred<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__0>
                            *)&local_60,_Var23), _Var21._M_current = _Var23._M_current, !bVar6)) {
      _Var23._M_current = _Var23._M_current + 1;
      goto LAB_0031a483;
    }
  }
LAB_0031a4b3:
  this_00 = &this->substitutionOpportunities;
  _Var23._M_current = _Var21._M_current + 1;
  if (_Var23._M_current != ppVar3 && _Var21._M_current != ppVar3) {
    __it._M_current = &local_38;
    do {
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::$_0>::
              operator()((_Iter_pred<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__0>
                          *)__it._M_current,_Var23);
      if (!bVar6) {
        (_Var21._M_current)->first = (_Var23._M_current)->first;
        (_Var21._M_current)->second = (_Var23._M_current)->second;
        _Var21._M_current = _Var21._M_current + 1;
      }
      _Var23._M_current = _Var23._M_current + 1;
    } while (_Var23._M_current != ppVar3);
  }
  RVar10 = (Result)__it._M_current;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::_M_erase
            (this_00,(iterator)_Var21._M_current,ppVar2 + uVar13);
  _Var23._M_current =
       (this->substitutionOpportunities).
       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  _Var21._M_current =
       (this->substitutionOpportunities).
       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (_Var23._M_current != _Var21._M_current) {
    uVar13 = (long)_Var21._M_current - (long)_Var23._M_current >> 3;
    iVar12 = 0;
    if (1 < uVar13) {
      iVar12 = 0;
      do {
        uVar13 = (long)uVar13 >> 1;
        iVar12 = iVar12 + 1;
      } while (1 < uVar13);
    }
    pdqsort_detail::
    pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1,false>
              (_Var23,_Var21,(anon_class_8_1_8991fb9c)this,iVar12,true);
  }
  ppVar22 = (this->substitutionOpportunities).
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->substitutionOpportunities).
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish == ppVar22) {
    bVar6 = true;
  }
  else {
    iVar12 = 0;
    uVar13 = 0;
    do {
      row = ppVar22[uVar13].first;
      if ((this->rowDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start[row] == '\0') {
        col = ppVar22[uVar13].second;
        if ((((this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start[col] != '\0') ||
            (bVar6 = isImpliedFree(this,col), !bVar6)) ||
           (bVar6 = isDualImpliedFree(this,row), !bVar6)) goto LAB_0031a6e9;
        HVar9 = findNonzero(this,row,col);
        if (HVar9 == -1) {
LAB_0031a864:
          (this_00->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
          _M_impl.super__Vector_impl_data._M_start[uVar13].first = -1;
          goto LAB_0031a6f1;
        }
        if ((this->model->integrality_).
            super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
            super__Vector_impl_data._M_start[col] == kInteger) {
          if ((this->rowsizeInteger).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[row] ==
              (this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[row]) {
            bVar6 = rowCoefficientsIntegral
                              (this,row,1.0 / (this->Avalue).
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_start[HVar9]);
            bVar7 = true;
            if (!bVar6) goto LAB_0031a640;
          }
          else {
LAB_0031a640:
            bVar7 = isImpliedIntegral(this,col);
          }
          if (bVar7 != false) goto LAB_0031a652;
          bVar19 = 4;
        }
        else {
LAB_0031a652:
          iVar14 = (this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[row];
          if ((iVar14 == 2) ||
             (iVar20 = (this->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[col], iVar20 == 2)) {
            getRowPositions(this,row,&this->rowpositions);
            pHVar5 = local_50;
            bVar19 = 1;
            substituteFreeCol(this,local_50,row,col,true);
            (this->substitutionOpportunities).
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start[uVar13].first = -1;
            RVar10 = removeRowSingletons(this,pHVar5);
            if (RVar10 == kOk) {
              RVar11 = checkLimits(this,pHVar5);
              bVar6 = RVar11 == kOk;
              bVar19 = bVar6 * '\x03' + 1;
LAB_0031a6e2:
              RVar10 = (Result)__it._M_current;
              if (!bVar6) {
                RVar10 = RVar11;
              }
            }
          }
          else {
            if (iVar14 < iVar20) {
              dVar25 = getMaxAbsRowVal(this,row);
            }
            else {
              lVar24 = (long)(this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[col];
              if (lVar24 == -1) {
                dVar25 = 0.0;
              }
              else {
                pdVar15 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start + lVar24;
                dVar25 = 0.0;
                do {
                  if (dVar25 <= ABS(*pdVar15)) {
                    dVar25 = ABS(*pdVar15);
                  }
                  iVar14 = (int)lVar24;
                  lVar24 = (long)(this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl
                                 .super__Vector_impl_data._M_start[iVar14];
                  pdVar15 = pdVar15 + (lVar24 - iVar14);
                } while (lVar24 != -1);
              }
            }
            pdVar4 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if (ABS(pdVar4[HVar9]) <
                dVar25 * (this->options->super_HighsOptionsStruct).presolve_pivot_threshold) {
              if ((this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[row] <
                  (this->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[col]) {
                lVar24 = (long)(this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl
                               .super__Vector_impl_data._M_start[col];
                if (lVar24 == -1) {
                  dVar25 = 0.0;
                }
                else {
                  pdVar15 = pdVar4 + lVar24;
                  dVar25 = 0.0;
                  do {
                    if (dVar25 <= ABS(*pdVar15)) {
                      dVar25 = ABS(*pdVar15);
                    }
                    iVar14 = (int)lVar24;
                    lVar24 = (long)(this->Anext).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[iVar14];
                    pdVar15 = pdVar15 + (lVar24 - iVar14);
                  } while (lVar24 != -1);
                }
              }
              else {
                dVar25 = getMaxAbsRowVal(this,row);
              }
              if (ABS((this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[HVar9]) <
                  dVar25 * (this->options->super_HighsOptionsStruct).presolve_pivot_threshold)
              goto LAB_0031a864;
            }
            getRowPositions(this,row,&this->rowpositions);
            iVar14 = 1 - ((this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[row] +
                         (this->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[col]);
            lVar24 = (long)(this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[col];
            if (lVar24 != -1) {
              piVar17 = (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              piVar16 = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar24;
              local_40 = piVar17;
              do {
                cVar8 = '\n';
                if (*piVar16 != row) {
                  local_54 = iVar14;
                  HVar9 = countFillin(this,*piVar16);
                  iVar14 = local_54 + HVar9;
                  cVar8 = ((this->options->super_HighsOptionsStruct).presolve_substitution_maxfillin
                          < iVar14) * '\t';
                  piVar17 = local_40;
                }
                if ((cVar8 != '\n') && (cVar8 != '\0')) break;
                iVar20 = (int)lVar24;
                lVar24 = (long)piVar17[iVar20];
                piVar16 = piVar16 + (lVar24 - iVar20);
              } while (lVar24 != -1);
            }
            pHVar5 = local_50;
            if ((this->options->super_HighsOptionsStruct).presolve_substitution_maxfillin < iVar14)
            {
              iVar12 = iVar12 + 1;
              bVar19 = (iVar12 != 3) * '\x02' + 2;
              __it._M_current = __it._M_current & 0xffffffff;
              goto LAB_0031a6f7;
            }
            bVar19 = 1;
            substituteFreeCol(this,local_50,row,col,true);
            (this->substitutionOpportunities).
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start[uVar13].first = -1;
            RVar10 = removeRowSingletons(this,pHVar5);
            iVar12 = 0;
            if (RVar10 == kOk) {
              RVar11 = checkLimits(this,pHVar5);
              bVar6 = RVar11 == kOk;
              bVar19 = !bVar6;
              goto LAB_0031a6e2;
            }
          }
          __it._M_current = (pair<int,_int> *)(ulong)RVar10;
        }
      }
      else {
LAB_0031a6e9:
        ppVar22[uVar13].first = -1;
LAB_0031a6f1:
        bVar19 = 4;
      }
LAB_0031a6f7:
      RVar10 = (Result)__it._M_current;
      if ((bVar19 & 3) != 0) goto LAB_0031a9cd;
      uVar13 = uVar13 + 1;
      ppVar22 = (this->substitutionOpportunities).
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar13 < (ulong)((long)(this->substitutionOpportunities).
                                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar22 >> 3)
            );
    bVar19 = 2;
LAB_0031a9cd:
    bVar6 = bVar19 == 2;
  }
  if (!bVar6) {
    return RVar10;
  }
  ppVar2 = (this->substitutionOpportunities).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  ppVar3 = (this->substitutionOpportunities).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar13 = (long)ppVar3 - (long)ppVar2;
  ppVar18 = ppVar2;
  if (0 < (long)uVar13 >> 5) {
    ppVar18 = (pair<int,_int> *)((long)&ppVar2->first + (uVar13 & 0xffffffffffffffe0));
    lVar24 = ((long)uVar13 >> 5) + 1;
    __first._M_current = ppVar2 + 2;
    do {
      if (__first._M_current[-2].first == -1) {
        __first._M_current = __first._M_current + -2;
        goto LAB_0031aa8a;
      }
      if (__first._M_current[-1].first == -1) {
        __first._M_current = __first._M_current + -1;
        goto LAB_0031aa8a;
      }
      if ((__first._M_current)->first == -1) goto LAB_0031aa8a;
      if (__first._M_current[1].first == -1) {
        __first._M_current = __first._M_current + 1;
        goto LAB_0031aa8a;
      }
      lVar24 = lVar24 + -1;
      __first._M_current = __first._M_current + 4;
    } while (1 < lVar24);
  }
  lVar24 = (long)ppVar3 - (long)ppVar18 >> 3;
  if (lVar24 != 1) {
    if (lVar24 != 2) {
      __first._M_current = ppVar3;
      if ((lVar24 != 3) || (__first._M_current = ppVar18, ppVar18->first == -1)) goto LAB_0031aa8a;
      ppVar18 = ppVar18 + 1;
    }
    __first._M_current = ppVar18;
    if (ppVar18->first == -1) goto LAB_0031aa8a;
    ppVar18 = ppVar18 + 1;
  }
  __first._M_current = ppVar18;
  if (ppVar18->first != -1) {
    __first._M_current = ppVar3;
  }
LAB_0031aa8a:
  ppVar18 = __first._M_current + 1;
  if (ppVar18 != ppVar3 && __first._M_current != ppVar3) {
    do {
      if (ppVar18->first != -1) {
        (__first._M_current)->first = ppVar18->first;
        (__first._M_current)->second = ppVar18->second;
        __first._M_current = __first._M_current + 1;
      }
      ppVar18 = ppVar18 + 1;
    } while (ppVar18 != ppVar3);
  }
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::_M_erase
            (this_00,__first,ppVar2 + uVar13);
  (this->analysis_).logging_on_ = bVar1;
  if (bVar1 != false) {
    HPresolveAnalysis::stopPresolveRuleLog(local_48,0xc);
  }
  return kOk;
}

Assistant:

HPresolve::Result HPresolve::aggregator(HighsPostsolveStack& postsolve_stack) {
  assert(analysis_.allow_rule_[kPresolveRuleAggregator]);
  const bool logging_on = analysis_.logging_on_;
  if (logging_on) analysis_.startPresolveRuleLog(kPresolveRuleAggregator);
  substitutionOpportunities.erase(
      std::remove_if(substitutionOpportunities.begin(),
                     substitutionOpportunities.end(),
                     [&](const std::pair<HighsInt, HighsInt>& p) {
                       HighsInt row = p.first;
                       HighsInt col = p.second;
                       return rowDeleted[row] || colDeleted[col] ||
                              !isImpliedFree(col) || !isDualImpliedFree(row);
                     }),
      substitutionOpportunities.end());

  pdqsort(
      substitutionOpportunities.begin(), substitutionOpportunities.end(),
      [&](const std::pair<HighsInt, HighsInt>& nz1,
          const std::pair<HighsInt, HighsInt>& nz2) {
        HighsInt minLen1 = std::min(rowsize[nz1.first], colsize[nz1.second]);
        HighsInt minLen2 = std::min(rowsize[nz2.first], colsize[nz2.second]);
        if (minLen1 == 2 && minLen2 != 2) return true;
        if (minLen2 == 2 && minLen1 != 2) return false;

        int64_t sizeProd1 = int64_t(rowsize[nz1.first]) * colsize[nz1.second];
        int64_t sizeProd2 = int64_t(rowsize[nz2.first]) * colsize[nz2.second];
        if (sizeProd1 < sizeProd2) return true;
        if (sizeProd2 < sizeProd1) return false;
        if (minLen1 < minLen2) return true;
        if (minLen2 < minLen1) return false;

        return std::make_tuple(HighsHashHelpers::hash(std::make_pair(
                                   uint32_t(nz1.first), uint32_t(nz1.second))),
                               nz1.first, nz1.second) <
               std::make_tuple(HighsHashHelpers::hash(std::make_pair(
                                   uint32_t(nz2.first), uint32_t(nz2.second))),
                               nz2.first, nz2.second);
      });

  HighsInt nfail = 0;
  for (size_t i = 0; i < substitutionOpportunities.size(); ++i) {
    HighsInt row = substitutionOpportunities[i].first;
    HighsInt col = substitutionOpportunities[i].second;

    if (rowDeleted[row] || colDeleted[col] || !isImpliedFree(col) ||
        !isDualImpliedFree(row)) {
      substitutionOpportunities[i].first = -1;
      continue;
    }

    HighsInt nzPos = findNonzero(row, col);
    if (nzPos == -1) {
      substitutionOpportunities[i].first = -1;
      continue;
    }
    if (model->integrality_[col] == HighsVarType::kInteger) {
      bool impliedIntegral =
          (rowsizeInteger[row] == rowsize[row] &&
           rowCoefficientsIntegral(row, 1.0 / Avalue[nzPos])) ||
          isImpliedIntegral(col);
      if (!impliedIntegral) continue;
    }

    // in the case where the row has length two or the column has length two
    // we always do the substitution since the fillin can never be problematic
    if (rowsize[row] == 2 || colsize[col] == 2) {
      storeRow(row);
      substituteFreeCol(postsolve_stack, row, col, true);
      substitutionOpportunities[i].first = -1;
      HPRESOLVE_CHECKED_CALL(removeRowSingletons(postsolve_stack));
      HPRESOLVE_CHECKED_CALL(checkLimits(postsolve_stack));
      continue;
    }

    double maxVal = rowsize[row] < colsize[col] ? getMaxAbsRowVal(row)
                                                : getMaxAbsColVal(col);
    if (std::fabs(Avalue[nzPos]) < maxVal * options->presolve_pivot_threshold) {
      maxVal = rowsize[row] < colsize[col] ? getMaxAbsColVal(col)
                                           : getMaxAbsRowVal(row);
      if (std::fabs(Avalue[nzPos]) <
          maxVal * options->presolve_pivot_threshold) {
        substitutionOpportunities[i].first = -1;
        continue;
      }
    }

    storeRow(row);
    HighsInt fillin = -(rowsize[row] + colsize[col] - 1);
    for (const auto& nz : getColumnVector(col)) {
      if (nz.index() == row) continue;
      fillin += countFillin(nz.index());

      if (fillin > options->presolve_substitution_maxfillin) break;
    }

    if (fillin > options->presolve_substitution_maxfillin) {
      ++nfail;
      // if the fill in is too much for multiple tries, then we stop
      // as this indicates that the rows/columns are becoming too dense
      // for substitutions
      if (nfail == 3) break;
      continue;
    }

    nfail = 0;
    substituteFreeCol(postsolve_stack, row, col, true);
    substitutionOpportunities[i].first = -1;
    HPRESOLVE_CHECKED_CALL(removeRowSingletons(postsolve_stack));
    HPRESOLVE_CHECKED_CALL(checkLimits(postsolve_stack));
  }

  substitutionOpportunities.erase(
      std::remove_if(
          substitutionOpportunities.begin(), substitutionOpportunities.end(),
          [](const std::pair<HighsInt, HighsInt>& p) { return p.first == -1; }),
      substitutionOpportunities.end());

  analysis_.logging_on_ = logging_on;
  if (logging_on) analysis_.stopPresolveRuleLog(kPresolveRuleAggregator);
  return Result::kOk;
}